

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walLimitSize(Wal *pWal,i64 nMax)

{
  uint uVar1;
  long in_RSI;
  long in_RDI;
  int rx;
  i64 sz;
  i64 *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  long local_18;
  
  sqlite3BeginBenignMalloc();
  uVar1 = sqlite3OsFileSize((sqlite3_file *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8);
  if ((uVar1 == 0) && (in_RSI < local_18)) {
    uVar1 = sqlite3OsTruncate((sqlite3_file *)(ulong)in_stack_ffffffffffffffe0,
                              (i64)in_stack_ffffffffffffffd8);
  }
  sqlite3EndBenignMalloc();
  if (uVar1 != 0) {
    sqlite3_log((int)(ulong)uVar1,"cannot limit WAL size: %s",*(undefined8 *)(in_RDI + 0x80));
  }
  return;
}

Assistant:

static void walLimitSize(Wal *pWal, i64 nMax){
  i64 sz;
  int rx;
  sqlite3BeginBenignMalloc();
  rx = sqlite3OsFileSize(pWal->pWalFd, &sz);
  if( rx==SQLITE_OK && (sz > nMax ) ){
    rx = sqlite3OsTruncate(pWal->pWalFd, nMax);
  }
  sqlite3EndBenignMalloc();
  if( rx ){
    sqlite3_log(rx, "cannot limit WAL size: %s", pWal->zWalName);
  }
}